

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iprog.c
# Opt level: O3

void close_elevator(ROOM_INDEX_DATA *pRoom)

{
  ROOM_INDEX_DATA *pRVar1;
  int iVar2;
  long lVar3;
  char mmsg [40];
  char local_48 [40];
  
  builtin_strncpy(local_48,"The lift doors close with a loud clang.",0x28);
  lVar3 = 0;
  do {
    if ((pRoom->exit[lVar3] != (EXIT_DATA *)0x0) &&
       (pRVar1 = (pRoom->exit[lVar3]->u1).to_room, pRVar1 != (ROOM_INDEX_DATA *)0x0)) {
      act(local_48,pRVar1->people,(void *)0x0,(void *)0x0,4);
      act(local_48,pRoom->people,(void *)0x0,(void *)0x0,4);
      pRVar1 = (pRoom->exit[lVar3]->u1).to_room;
      iVar2 = reverse_d((int)lVar3);
      if ((pRVar1->exit[iVar2]->u1).to_room != (ROOM_INDEX_DATA *)0x0) {
        iVar2 = reverse_d((int)lVar3);
        (pRVar1->exit[iVar2]->u1).to_room = (ROOM_INDEX_DATA *)0x0;
      }
      (pRoom->exit[lVar3]->u1).to_room = (ROOM_INDEX_DATA *)0x0;
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 6);
  return;
}

Assistant:

void close_elevator(ROOM_INDEX_DATA *pRoom)
{
	int i;
	ROOM_INDEX_DATA *toRoom;
	const char mmsg[] = "The lift doors close with a loud clang.";

	for (i = 0; i < MAX_DIR; i++)
	{
		if (pRoom->exit[i] && pRoom->exit[i]->u1.to_room)
		{
			act(mmsg, pRoom->exit[i]->u1.to_room->people, 0, 0, TO_ALL);
			act(mmsg, pRoom->people, 0, 0, TO_ALL);

			toRoom = pRoom->exit[i]->u1.to_room;

			if (toRoom->exit[reverse_d(i)]->u1.to_room)
				toRoom->exit[reverse_d(i)]->u1.to_room = nullptr;

			pRoom->exit[i]->u1.to_room = nullptr;
		}
	}
}